

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-io.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppiVar1;
  char *buffer;
  ostream *poVar2;
  char *buffer_00;
  value_type_conflict4 *__val;
  uint i_1;
  uint i;
  long lVar3;
  value_type_conflict4 *__val_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shape;
  communicator world;
  DiscreteBounds full_box;
  environment env;
  NumPy writer;
  BOV reader;
  DiscreteBounds box;
  NumPy reader2;
  file in;
  datatype local_f8;
  DiscreteBounds sub_box;
  file out;
  file in2;
  
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = argc;
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = argv;
  MPI_Init_thread(&full_box,&box,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = 0x10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&shape,(iterator)0x0,(uint *)&box);
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = 0x10;
  if (shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&shape,(iterator)
                      shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish,(uint *)&box);
  }
  else {
    *shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x10;
    shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  diy::Bounds<int>::Bounds(&box,2);
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 4;
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 4;
  box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 7;
  box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 7;
  ppiVar1 = &full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end;
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = ppiVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&full_box,"test.bin","");
  diy::mpi::io::file::file(&in,&world,(string *)&full_box,2);
  if ((pointer *)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ !=
      ppiVar1) {
    operator_delete((void *)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                            _0_8_,
                    (long)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                    + 1);
  }
  diy::io::BOV::BOV<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&reader,&in,&shape,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  buffer = (char *)operator_new(0x40);
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = &ompi_mpi_float;
  diy::mpi::io::file::read_bov
            (reader.f_,&box,
             (int)((ulong)((long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),
             reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,buffer,reader.offset_,(datatype *)&full_box,false,1);
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<double>((double)*(float *)(buffer + lVar3 * 4));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = ppiVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&full_box,"test.npy","");
  diy::mpi::io::file::file(&in2,&world,(string *)&full_box,2);
  if ((pointer *)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ !=
      ppiVar1) {
    operator_delete((void *)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                            _0_8_,
                    (long)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                    + 1);
  }
  reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader2.super_BOV.offset_ = 0;
  reader2.super_BOV.f_ = &in2;
  diy::io::NumPy::read_header(&reader2);
  buffer_00 = (char *)operator_new(0x40);
  buffer_00[0x30] = '\0';
  buffer_00[0x31] = '\0';
  buffer_00[0x32] = '\0';
  buffer_00[0x33] = '\0';
  buffer_00[0x34] = '\0';
  buffer_00[0x35] = '\0';
  buffer_00[0x36] = '\0';
  buffer_00[0x37] = '\0';
  buffer_00[0x38] = '\0';
  buffer_00[0x39] = '\0';
  buffer_00[0x3a] = '\0';
  buffer_00[0x3b] = '\0';
  buffer_00[0x3c] = '\0';
  buffer_00[0x3d] = '\0';
  buffer_00[0x3e] = '\0';
  buffer_00[0x3f] = '\0';
  buffer_00[0x20] = '\0';
  buffer_00[0x21] = '\0';
  buffer_00[0x22] = '\0';
  buffer_00[0x23] = '\0';
  buffer_00[0x24] = '\0';
  buffer_00[0x25] = '\0';
  buffer_00[0x26] = '\0';
  buffer_00[0x27] = '\0';
  buffer_00[0x28] = '\0';
  buffer_00[0x29] = '\0';
  buffer_00[0x2a] = '\0';
  buffer_00[0x2b] = '\0';
  buffer_00[0x2c] = '\0';
  buffer_00[0x2d] = '\0';
  buffer_00[0x2e] = '\0';
  buffer_00[0x2f] = '\0';
  buffer_00[0x10] = '\0';
  buffer_00[0x11] = '\0';
  buffer_00[0x12] = '\0';
  buffer_00[0x13] = '\0';
  buffer_00[0x14] = '\0';
  buffer_00[0x15] = '\0';
  buffer_00[0x16] = '\0';
  buffer_00[0x17] = '\0';
  buffer_00[0x18] = '\0';
  buffer_00[0x19] = '\0';
  buffer_00[0x1a] = '\0';
  buffer_00[0x1b] = '\0';
  buffer_00[0x1c] = '\0';
  buffer_00[0x1d] = '\0';
  buffer_00[0x1e] = '\0';
  buffer_00[0x1f] = '\0';
  buffer_00[0] = '\0';
  buffer_00[1] = '\0';
  buffer_00[2] = '\0';
  buffer_00[3] = '\0';
  buffer_00[4] = '\0';
  buffer_00[5] = '\0';
  buffer_00[6] = '\0';
  buffer_00[7] = '\0';
  buffer_00[8] = '\0';
  buffer_00[9] = '\0';
  buffer_00[10] = '\0';
  buffer_00[0xb] = '\0';
  buffer_00[0xc] = '\0';
  buffer_00[0xd] = '\0';
  buffer_00[0xe] = '\0';
  buffer_00[0xf] = '\0';
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = &ompi_mpi_float;
  diy::mpi::io::file::read_bov
            (reader2.super_BOV.f_,&box,
             (int)((ulong)((long)reader2.super_BOV.shape_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)reader2.super_BOV.shape_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),
             reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,buffer_00,reader2.super_BOV.offset_,
             (datatype *)&full_box,false,1);
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<double>((double)*(float *)(buffer_00 + lVar3 * 4));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ =
       &full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end;
  std::__cxx11::string::_M_construct<char_const*>((string *)&full_box,"out.npy","");
  diy::mpi::io::file::file(&out,&world,(string *)&full_box,5);
  if ((pointer *)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ !=
      &full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end) {
    operator_delete((void *)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                            _0_8_,
                    (long)full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                    + 1);
  }
  writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.super_BOV.offset_ = 0;
  writer.super_BOV.f_ = &out;
  diy::Bounds<int>::Bounds(&full_box,2);
  diy::Bounds<int>::Bounds(&sub_box,2);
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
  full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 3;
  full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 3;
  sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 1;
  sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 1;
  sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 2;
  sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 2;
  diy::io::NumPy::write_header<float>(&writer,2,&full_box);
  local_f8.handle.data = (DIY_MPI_Datatype)&ompi_mpi_float;
  diy::mpi::io::file::write_bov
            (writer.super_BOV.f_,&full_box,&sub_box,
             (int)((ulong)((long)writer.super_BOV.shape_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)writer.super_BOV.shape_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),
             writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,buffer_00,writer.super_BOV.offset_,&local_f8,false,1);
  sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  if (writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(writer.super_BOV.stride_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)writer.super_BOV.stride_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)writer.super_BOV.stride_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  diy::mpi::io::file::~file(&out);
  operator_delete(buffer_00,0x40);
  if (reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reader2.super_BOV.stride_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)reader2.super_BOV.stride_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)reader2.super_BOV.stride_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  diy::mpi::io::file::~file(&in2);
  operator_delete(buffer,0x40);
  if (reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)reader.stride_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)reader.stride_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  diy::mpi::io::file::~file(&in);
  box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data != (pointer)0x0
     ) {
    operator_delete(box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data,
                    box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data != (pointer)0x0
     ) {
    operator_delete(box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data,
                    box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  if (shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  std::vector<unsigned> shape;
  shape.push_back(16);
  shape.push_back(16);

  diy::DiscreteBounds box(2);
  box.min[0] = box.min[1] = 4;
  box.max[0] = box.max[1] = 7;

  diy::mpi::io::file in(world, "test.bin", diy::mpi::io::file::rdonly);
  diy::io::BOV reader(in, shape);

  std::cout << "Reading" << std::endl;
  std::vector<float> data(16);
  reader.read(box, &data[0]);

  for (unsigned i = 0; i < data.size(); ++i)
    std::cout << data[i] << std::endl;

  std::cout << "---" << std::endl;
  diy::mpi::io::file in2(world, "test.npy", diy::mpi::io::file::rdonly);
  diy::io::NumPy  reader2(in2);
  reader2.read_header();
  std::vector<float> data2(16);
  reader2.read(box, &data2[0]);

  for (unsigned i = 0; i < data2.size(); ++i)
    std::cout << data2[i] << std::endl;

  diy::mpi::io::file out(world, "out.npy", diy::mpi::io::file::wronly | diy::mpi::io::file::create);
  diy::io::NumPy     writer(out);
  diy::DiscreteBounds full_box(2), sub_box(2);
  full_box.min[0] = full_box.min[1] = 0;
  full_box.max[0] = full_box.max[1] = 3;
  sub_box.min[0] = sub_box.min[1] = 1;
  sub_box.max[0] = sub_box.max[1] = 2;
  writer.write_header<float>(2, full_box);
  //writer.write(full_box, &data2[0]);
  writer.write(full_box, &data2[0], sub_box);
}